

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

ostream * std::operator<<(ostream *stream,view_type *value)

{
  char *pcVar1;
  value_type *item;
  char *pcVar2;
  
  pcVar1 = value->tail;
  for (pcVar2 = value->head; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    std::operator<<(stream,*pcVar2);
  }
  return stream;
}

Assistant:

std::ostream& operator<< (std::ostream& stream,
                          const decoder_type::view_type& value)
{
    for (auto&& item : value)
    {
        stream << item;
    }
    return stream;
}